

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

bool __thiscall
iDynTree::Model::addAdditionalFrameToLink
          (Model *this,string *linkName,string *frameName,Transform *link_H_frame)

{
  bool bVar1;
  string error;
  LinkIndex linkIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  LinkIndex local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_b0 = getLinkIndex(this,linkName);
  if (local_b0 == LINK_INVALID_INDEX) {
    std::operator+(&local_68,"error adding frame ",frameName);
    std::operator+(&local_88,&local_68," : a link of name ");
    std::operator+(&local_a8,&local_88,linkName);
    std::operator+(&local_d0,&local_a8," is not present in the model");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    iDynTree::reportError("Model","addAdditionalFrameToLink",local_d0._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::string((string *)&local_48,(string *)frameName);
    bVar1 = isFrameNameUsed(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar1) {
      std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::push_back
                (&this->additionalFrames,link_H_frame);
      std::vector<long,_std::allocator<long>_>::push_back(&this->additionalFramesLinks,&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->frameNames,frameName);
      return true;
    }
    std::operator+(&local_a8,"a link or frame of name ",frameName);
    std::operator+(&local_d0,&local_a8," is already present in the model");
    std::__cxx11::string::~string((string *)&local_a8);
    iDynTree::reportError("Model","addAdditionalFrameToLink",local_d0._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  return false;
}

Assistant:

bool Model::addAdditionalFrameToLink(const std::string& linkName,
                                     const std::string& frameName,
                                     Transform link_H_frame)
{
    // Check that the link actually exist
    LinkIndex linkIndex = this->getLinkIndex(linkName);
    if( linkIndex == LINK_INVALID_INDEX )
    {
        std::string error = "error adding frame " + frameName + " : a link of name "
                            + linkName + " is not present in the model";
        reportError("Model","addAdditionalFrameToLink",error.c_str());
        return false;
    }

    // Check that the frame name is not already used by a link or frame
    if(isFrameNameUsed(frameName))
    {
        std::string error = "a link or frame of name " + frameName + " is already present in the model";
        reportError("Model","addAdditionalFrameToLink",error.c_str());
        return false;
    }

    // If all error has passed, actually add the frame
    assert(additionalFrames.size() == additionalFramesLinks.size());
    assert(additionalFrames.size() == frameNames.size());
    this->additionalFrames.push_back(link_H_frame);
    this->additionalFramesLinks.push_back(linkIndex);
    this->frameNames.push_back(frameName);

    return true;
}